

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O1

void test_one<wchar_t>(locale *l,string *ia,string *ib,int diff)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  collate *pcVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> b;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> a;
  string local_c0;
  string local_a0;
  string local_80;
  locale local_60 [8];
  locale local_58 [8];
  wchar_t *local_50;
  ulong local_48;
  wchar_t local_40 [4];
  
  std::locale::locale(local_58,l);
  to_correct_string<wchar_t>(&local_80,(locale *)ia);
  std::locale::~locale(local_58);
  std::locale::locale(local_60,l);
  to_correct_string<wchar_t>(&local_a0,(locale *)ib);
  std::locale::~locale(local_60);
  if (diff < 0) {
    test_counter = test_counter + 1;
    pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
    iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                      (pcVar5,local_80._M_dataplus._M_p,
                       local_80._M_dataplus._M_p + local_80._M_string_length * 4,
                       local_a0._M_dataplus._M_p,
                       local_a0._M_dataplus._M_p + local_a0._M_string_length * 4);
    if (-1 < iVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," l(a,b)",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar3 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_c0);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
    iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                      (pcVar5,local_a0._M_dataplus._M_p,
                       local_a0._M_dataplus._M_p + local_a0._M_string_length * 4,
                       local_80._M_dataplus._M_p,
                       local_80._M_dataplus._M_p + local_80._M_string_length * 4);
    if (iVar3 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," !l(b,a)",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar3 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_c0);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  else {
    test_counter = test_counter + 1;
    if (diff == 0) {
      pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
      iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                        (pcVar5,local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length * 4,
                         local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length * 4);
      if (iVar3 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," !l(a,b)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar3 = error_counter + 1;
        bVar2 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar7,&local_c0);
          __cxa_throw(prVar7,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
      iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                        (pcVar5,local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length * 4,
                         local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length * 4);
      if (iVar3 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," !l(b,a)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar3 = error_counter + 1;
        bVar2 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar7,&local_c0);
          __cxa_throw(prVar7,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    else {
      pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
      iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                        (pcVar5,local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length * 4,
                         local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length * 4);
      if (iVar3 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x31);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," !l(a,b)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar3 = error_counter + 1;
        bVar2 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar7,&local_c0);
          __cxa_throw(prVar7,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
      iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                        (pcVar5,local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length * 4,
                         local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length * 4);
      if (-1 < iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," l(b,a)",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar3 = error_counter + 1;
        bVar2 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar7,&local_c0);
          __cxa_throw(prVar7,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
  }
  pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
  test_counter = test_counter + 1;
  iVar3 = (**(code **)(*(long *)pcVar5 + 0x10))
                    (pcVar5,local_80._M_dataplus._M_p,
                     local_80._M_dataplus._M_p + local_80._M_string_length * 4,
                     local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length * 4);
  if (iVar3 != diff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size())",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_c0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  (**(code **)(*(long *)pcVar5 + 0x18))
            (&local_c0,pcVar5,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length * 4);
  (**(code **)(*(long *)pcVar5 + 0x18))
            (&local_50,pcVar5,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length * 4);
  uVar8 = local_c0._M_string_length;
  if (local_48 < local_c0._M_string_length) {
    uVar8 = local_48;
  }
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  else {
    uVar4 = wmemcmp((wchar_t *)local_c0._M_dataplus._M_p,local_50,uVar8);
    uVar8 = (ulong)uVar4;
  }
  if ((int)uVar8 == 0) {
    uVar8 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_c0._M_string_length - local_48)) {
      uVar8 = local_c0._M_string_length - local_48;
    }
    if (0x7ffffffe < (long)uVar8) {
      uVar8 = 0x7fffffff;
    }
  }
  uVar4 = 0xffffffff;
  if (-1 < (int)uVar8) {
    uVar4 = (uint)((int)uVar8 != 0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (uVar4 != diff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size())))"
               ,0x73);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_c0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (diff == 0) {
    test_counter = test_counter + 1;
    lVar9 = (**(code **)(*(long *)pcVar5 + 0x20))
                      (pcVar5,local_80._M_dataplus._M_p,
                       local_80._M_dataplus._M_p + local_80._M_string_length * 4);
    lVar10 = (**(code **)(*(long *)pcVar5 + 0x20))
                       (pcVar5,local_a0._M_dataplus._M_p,
                        local_a0._M_dataplus._M_p + local_a0._M_string_length * 4);
    if (lVar9 != lVar10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 " col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size())"
                 ,0x51);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar3 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_c0);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void test_one(std::locale const &l,std::string ia,std::string ib,int diff)
{
    std::basic_string<CharType> a=to_correct_string<CharType>(ia,l);
    std::basic_string<CharType> b=to_correct_string<CharType>(ib,l);
    if(diff < 0) {
        TEST(l(a,b));
        TEST(!l(b,a));
    }
    else if(diff == 0) {
        TEST(!l(a,b));
        TEST(!l(b,a));
    }
    else {
        TEST(!l(a,b));
        TEST(l(b,a));
    }
    
    std::collate<CharType> const &col = std::use_facet<std::collate<CharType> >(l);

    TEST(diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size()));
    TEST(diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size()))));
    if(diff == 0) {
        TEST(col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size()));
    }
}